

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O1

Vec_Int_t *
Wlc_NtkDeriveFirstTotal
          (Wlc_Ntk_t *p,Vec_Int_t *vMemObjs,Vec_Int_t *vMemFanins,int iFirstMemPi,int iFirstMemCi,
          int fVerbose)

{
  Wlc_Obj_t *pWVar1;
  int iVar2;
  int *piVar3;
  Wlc_Obj_t *pWVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  int *__s;
  char *pcVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar12;
  ulong uVar13;
  int iVar14;
  int *piVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  
  iVar2 = vMemObjs->nSize;
  uVar20 = (long)iVar2 * 3;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar5 = (int)uVar20;
  iVar9 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar9 = iVar5;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar9;
  if (iVar9 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar9 << 2);
  }
  pVVar7->pArray = __s;
  pVVar7->nSize = iVar5;
  if (__s != (int *)0x0) {
    memset(__s,0,(long)iVar2 * 0xc);
  }
  iVar9 = vMemObjs->nSize;
  if ((long)iVar9 < 1) {
    iVar11 = 0;
  }
  else {
    piVar3 = vMemObjs->pArray;
    iVar14 = 0;
    lVar16 = 0;
    iVar11 = 0;
    piVar15 = __s;
    do {
      iVar10 = piVar3[lVar16];
      if (((long)iVar10 < 1) || (p->nObjsAlloc <= iVar10)) {
LAB_0035db90:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pWVar4 = p->pObjs;
      pWVar1 = pWVar4 + iVar10;
      uVar17 = *(ushort *)pWVar1 & 0x3f;
      if (uVar17 - 0x36 < 2) {
        uVar13 = (ulong)pWVar1->nFanins;
        if (0 < (int)pWVar1->nFanins) {
          lVar18 = 0;
          do {
            if ((2 < (uint)uVar13) ||
               (paVar12 = &pWVar1->field_10,
               (undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x2f) ==
               (undefined1  [24])0x6)) {
              paVar12 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
            }
            if (lVar18 != 0) {
              uVar17 = paVar12->Fanins[lVar18];
              if (((int)uVar17 < 1) || (p->nObjsAlloc <= (int)uVar17)) goto LAB_0035db90;
              if (iVar5 <= iVar14 + (int)lVar18) goto LAB_0035dbaf;
              iVar6 = pWVar4[uVar17].End - pWVar4[uVar17].Beg;
              iVar10 = -iVar6;
              if (0 < iVar6) {
                iVar10 = iVar6;
              }
              piVar15[lVar18] = iVar10 + 1U | iFirstMemCi << 10;
              iVar6 = pWVar4[uVar17].End - pWVar4[uVar17].Beg;
              iVar10 = -iVar6;
              if (0 < iVar6) {
                iVar10 = iVar6;
              }
              iFirstMemCi = iFirstMemCi + iVar10 + 1;
              iVar11 = iVar11 + 1;
            }
            lVar18 = lVar18 + 1;
            uVar13 = (ulong)(int)pWVar1->nFanins;
          } while (lVar18 < (long)uVar13);
        }
        if ((undefined1  [24])((undefined1  [24])*pWVar1 & (undefined1  [24])0x3f) ==
            (undefined1  [24])0x36) {
          if (iVar5 <= (int)lVar16 * 3 + 2) {
LAB_0035dbaf:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          iVar6 = pWVar1->End - pWVar1->Beg;
          iVar10 = -iVar6;
          if (0 < iVar6) {
            iVar10 = iVar6;
          }
          __s[lVar16 * 3 + 2] = iVar10 + 1U | iFirstMemPi << 10;
          iVar6 = pWVar1->End - pWVar1->Beg;
          iVar10 = -iVar6;
          if (0 < iVar6) {
            iVar10 = iVar6;
          }
          iFirstMemPi = iFirstMemPi + iVar10 + 1;
        }
      }
      else if (uVar17 == 8) {
        paVar12 = &pWVar1->field_10;
        if (((*(ushort *)pWVar1 & 0x2f) == 6) || (2 < pWVar1->nFanins)) {
          paVar12 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar12->pFanins[0];
        }
        lVar18 = (long)paVar12->Fanins[0];
        if ((lVar18 < 1) || (p->nObjsAlloc <= paVar12->Fanins[0])) goto LAB_0035db90;
        if (pWVar4[lVar18].End != pWVar4[lVar18].Beg) {
          __assert_fail("Wlc_ObjRange(pFanin) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                        ,0x2a8,
                        "Vec_Int_t *Wlc_NtkDeriveFirstTotal(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, int, int, int)"
                       );
        }
        if (iVar5 <= (int)lVar16 * 3) goto LAB_0035dbaf;
        __s[lVar16 * 3] = iFirstMemCi * 0x400 + 1;
        iVar6 = pWVar4[lVar18].End - pWVar4[lVar18].Beg;
        iVar10 = -iVar6;
        if (0 < iVar6) {
          iVar10 = iVar6;
        }
        iFirstMemCi = iFirstMemCi + iVar10 + 1;
        iVar11 = iVar11 + 1;
      }
      lVar16 = lVar16 + 1;
      iVar14 = iVar14 + 3;
      piVar15 = piVar15 + 3;
    } while (lVar16 != iVar9);
  }
  if (iVar11 != vMemFanins->nSize) {
    __assert_fail("nMemFanins == Vec_IntSize(vMemFanins)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                  ,0x2bf,
                  "Vec_Int_t *Wlc_NtkDeriveFirstTotal(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, int, int, int)"
                 );
  }
  if (0 < iVar2 && fVerbose != 0) {
    uVar13 = 1;
    if (1 < iVar5) {
      uVar13 = uVar20 & 0xffffffff;
    }
    uVar20 = 0;
    do {
      uVar19 = uVar20 & 0xffffffff;
      uVar17 = __s[uVar20];
      printf("Obj %5d  Fanin %5d : ",uVar19 / 3,(ulong)(uint)((int)uVar20 + (int)(uVar19 / 3) * -3))
      ;
      if (vMemObjs->nSize <= (int)(uVar19 / 3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      pcVar8 = Wlc_ObjName(p,vMemObjs->pArray[uVar19 / 3]);
      printf("%16s : %d(%d)\n",pcVar8,(ulong)(uint)((int)uVar17 >> 10),(ulong)(uVar17 & 0x3ff));
      uVar20 = uVar20 + 1;
    } while (uVar13 != uVar20);
  }
  return pVVar7;
}

Assistant:

Vec_Int_t * Wlc_NtkDeriveFirstTotal( Wlc_Ntk_t * p, Vec_Int_t * vMemObjs, Vec_Int_t * vMemFanins, int iFirstMemPi, int iFirstMemCi, int fVerbose )
{
    Vec_Int_t * vFirstTotal = Vec_IntStart( 3 * Vec_IntSize(vMemObjs) ); // contains pairs of (first CO bit: range) for each input/output of a node
    Wlc_Obj_t * pObj, * pFanin; int i, k, iFanin, nMemFanins = 0;
    Wlc_NtkForEachObjVec( vMemObjs, p, pObj, i )
    {
        if ( Wlc_ObjType(pObj) == WLC_OBJ_MUX )
        {
            //Vec_IntPush( vMemFanins, Wlc_ObjFaninId0(pObj) );
            pFanin = Wlc_ObjFanin0(p, pObj);
            assert( Wlc_ObjRange(pFanin) == 1 );
            Vec_IntWriteEntry( vFirstTotal, 3*i, (iFirstMemCi << 10) | Wlc_ObjRange(pFanin) );
            iFirstMemCi += Wlc_ObjRange(pFanin);
            nMemFanins++;
        }
        else if ( Wlc_ObjType(pObj) == WLC_OBJ_READ || Wlc_ObjType(pObj) == WLC_OBJ_WRITE )
        {
            Wlc_ObjForEachFanin( pObj, iFanin, k )
                if ( k > 0 )
                {
                    //Vec_IntPush( vMemFanins, iFanin );
                    pFanin = Wlc_NtkObj(p, iFanin);
                    Vec_IntWriteEntry( vFirstTotal, 3*i + k, (iFirstMemCi << 10) | Wlc_ObjRange(pFanin) );
                    iFirstMemCi += Wlc_ObjRange(pFanin);
                    nMemFanins++;
                }
            if ( Wlc_ObjType(pObj) == WLC_OBJ_READ )
            {
                Vec_IntWriteEntry( vFirstTotal, 3*i + 2, (iFirstMemPi << 10) | Wlc_ObjRange(pObj) );
                iFirstMemPi += Wlc_ObjRange(pObj);
            }
        }
    }
    assert( nMemFanins == Vec_IntSize(vMemFanins) );
    if ( fVerbose )
    Vec_IntForEachEntry( vFirstTotal, iFanin, i )
    {
        printf( "Obj %5d  Fanin %5d : ", i/3, i%3 );
        printf( "%16s : %d(%d)\n", Wlc_ObjName(p, Vec_IntEntry(vMemObjs, i/3)), iFanin >> 10, iFanin & 0x3FF );
    }
    return vFirstTotal;
}